

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall dap::json::JsonCppDeserializer::deserialize(JsonCppDeserializer *this,object *v)

{
  bool bVar1;
  bool bVar2;
  ArrayIndex AVar3;
  mapped_type *this_00;
  const_iterator cVar4;
  JsonCppDeserializer d;
  any val;
  JsonCppDeserializer local_b0;
  undefined1 local_98 [8];
  TypeInfo *pTStack_90;
  void *local_88;
  String local_60;
  ValueIteratorBase local_40;
  
  AVar3 = Json::Value::size(this->json);
  std::__detail::
  _Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)v,(ulong)AVar3);
  cVar4 = Json::Value::begin(this->json);
  local_40.current_ = cVar4.super_ValueIteratorBase.current_._M_node;
  local_40.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
  do {
    cVar4 = Json::Value::end(this->json);
    local_98 = (undefined1  [8])cVar4.super_ValueIteratorBase.current_._M_node;
    pTStack_90 = (TypeInfo *)CONCAT71(pTStack_90._1_7_,cVar4.super_ValueIteratorBase.isNull_);
    bVar1 = Json::ValueIteratorBase::operator!=(&local_40,(SelfType *)local_98);
    if (!bVar1) {
LAB_006f3d83:
      return !bVar1;
    }
    local_b0.json = Json::ValueIteratorBase::deref(&local_40);
    local_b0.super_Deserializer._vptr_Deserializer =
         (_func_int **)&PTR__JsonCppDeserializer_00a2c6e0;
    local_b0.ownsJson = false;
    local_98 = (undefined1  [8])0x0;
    pTStack_90 = (TypeInfo *)0x0;
    local_88 = (void *)0x0;
    bVar2 = deserialize(&local_b0,(any *)local_98);
    if (!bVar2) {
      any::~any((any *)local_98);
      ~JsonCppDeserializer(&local_b0);
      goto LAB_006f3d83;
    }
    Json::ValueIteratorBase::name_abi_cxx11_(&local_60,&local_40);
    this_00 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dap::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)v,&local_60);
    any::operator=(this_00,(any *)local_98);
    std::__cxx11::string::~string((string *)&local_60);
    any::~any((any *)local_98);
    ~JsonCppDeserializer(&local_b0);
    Json::ValueConstIterator::operator++((ValueConstIterator *)&local_40,0);
  } while( true );
}

Assistant:

bool JsonCppDeserializer::deserialize(dap::object* v) const {
  v->reserve(json->size());
  for (auto i = json->begin(); i != json->end(); i++) {
    JsonCppDeserializer d(&*i);
    dap::any val;
    if (!d.deserialize(&val)) {
      return false;
    }
    (*v)[i.name()] = val;
  }
  return true;
}